

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O0

void * raviX_ptrlist_undo_last(PtrList **self)

{
  PtrList *pPVar1;
  void *pvVar2;
  byte bVar3;
  int iVar4;
  int nr;
  void *ptr;
  PtrList *first;
  PtrList *last;
  PtrList **self_local;
  
  pPVar1 = *self;
  first = pPVar1;
  if (pPVar1 != (PtrList *)0x0) {
    do {
      first = first->prev_;
      if ((char)*(ushort *)first != '\0') {
        bVar3 = (char)*(ushort *)first - 1;
        *(ushort *)first = *(ushort *)first & 0xff00 | (ushort)bVar3;
        iVar4 = (int)(short)(char)bVar3;
        pvVar2 = first->list_[iVar4];
        first->list_[iVar4] = (void *)0xf1f1f1f1;
        return pvVar2;
      }
    } while (first != pPVar1);
  }
  return (void *)0x0;
}

Assistant:

void *raviX_ptrlist_undo_last(PtrList **self)
{
	PtrList *last, *first = *self;

	if (!first)
		return NULL;
	last = first;
	do {
		last = last->prev_;
		if (last->nr_) {
			void *ptr;
			int nr = --last->nr_;
			ptr = last->list_[nr];
			last->list_[nr] = (void *)((intptr_t)0xf1f1f1f1);
			return ptr;
		}
	} while (last != first);
	return NULL;
}